

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int stateResortCompare(void *a,void *b)

{
  long lVar1;
  long lVar2;
  int iVar3;
  
  lVar1 = *a;
  lVar2 = *b;
  iVar3 = *(int *)(lVar2 + 0x24) - *(int *)(lVar1 + 0x24);
  if ((iVar3 == 0) && (iVar3 = *(int *)(lVar2 + 0x20) - *(int *)(lVar1 + 0x20), iVar3 == 0)) {
    iVar3 = *(int *)(lVar2 + 0x10) - *(int *)(lVar1 + 0x10);
    if (iVar3 == 0) {
      __assert_fail("n!=0","/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/lemon.c"
                    ,0x13fc,"int stateResortCompare(const void *, const void *)");
    }
  }
  return iVar3;
}

Assistant:

static int stateResortCompare(const void *a, const void *b){
  const struct state *pA = *(const struct state**)a;
  const struct state *pB = *(const struct state**)b;
  int n;

  n = pB->nNtAct - pA->nNtAct;
  if( n==0 ){
    n = pB->nTknAct - pA->nTknAct;
    if( n==0 ){
      n = pB->statenum - pA->statenum;
    }
  }
  assert( n!=0 );
  return n;
}